

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hierarchy.c
# Opt level: O1

_Bool ecs_scope_next(ecs_iter_t *it)

{
  ecs_vector_t *vector;
  ecs_table_t *table;
  _Bool _Var1;
  int32_t iVar2;
  int32_t iVar3;
  undefined8 *puVar4;
  ecs_data_t *peVar5;
  ecs_entity_t *peVar6;
  bool bVar7;
  int index;
  ecs_filter_t filter;
  ecs_filter_t local_48;
  
  vector = (it->iter).parent.tables;
  local_48.include_kind = *(ecs_match_kind_t *)((long)&it->iter + 0x10);
  local_48.exclude_kind = *(ecs_match_kind_t *)((long)&it->iter + 0x14);
  local_48.include = (it->iter).parent.filter.include;
  local_48.exclude = (it->iter).parent.filter.exclude;
  iVar2 = ecs_vector_count(vector);
  index = (it->iter).parent.index;
  bVar7 = index < iVar2;
  if (index < iVar2) {
    do {
      puVar4 = (undefined8 *)_ecs_vector_get(vector,8,0x10,index);
      table = (ecs_table_t *)*puVar4;
      _ecs_assert(table != (ecs_table_t *)0x0,0xc,(char *)0x0,"table != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/hierarchy.c"
                  ,0x1b7);
      if (table == (ecs_table_t *)0x0) {
        __assert_fail("table != ((void*)0)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/hierarchy.c"
                      ,0x1b7,"_Bool ecs_scope_next(ecs_iter_t *)");
      }
      peVar5 = ecs_table_get_data(table);
      if (peVar5 != (ecs_data_t *)0x0) {
        iVar3 = ecs_table_count(table);
        it->count = iVar3;
        if ((iVar3 != 0) &&
           ((local_48.exclude == (ecs_type_t)0x0 && local_48.include == (ecs_type_t)0x0 ||
            (_Var1 = ecs_table_match_filter(it->world,table,&local_48), _Var1)))) {
          (it->iter).parent.table.table = table;
          it->table = (ecs_iter_table_t *)((long)&it->iter + 0x28);
          it->table_columns = peVar5->columns;
          iVar2 = ecs_table_count(table);
          it->count = iVar2;
          peVar6 = (ecs_entity_t *)_ecs_vector_first(peVar5->entities,8,0x10);
          it->entities = peVar6;
          (it->iter).parent.index = index + 1;
          return bVar7;
        }
      }
      index = index + 1;
      bVar7 = index < iVar2;
    } while (index != iVar2);
  }
  return bVar7;
}

Assistant:

bool ecs_scope_next(
    ecs_iter_t *it)
{
    ecs_scope_iter_t *iter = &it->iter.parent;
    ecs_vector_t *tables = iter->tables;
    ecs_filter_t filter = iter->filter;

    int32_t count = ecs_vector_count(tables);
    int32_t i;

    for (i = iter->index; i < count; i ++) {
        ecs_table_t *table = *ecs_vector_get(tables, ecs_table_t*, i);
        ecs_assert(table != NULL, ECS_INTERNAL_ERROR, NULL);

        ecs_data_t *data = ecs_table_get_data(table);
        if (!data) {
            continue;
        }

        it->count = ecs_table_count(table);
        if (!it->count) {
            continue;
        }

        if (filter.include || filter.exclude) {
            if (!ecs_table_match_filter(it->world, table, &filter)) {
                continue;
            }
        }

        iter->table.table = table;
        it->table = &iter->table;
        it->table_columns = data->columns;
        it->count = ecs_table_count(table);
        it->entities = ecs_vector_first(data->entities, ecs_entity_t);
        iter->index = i + 1;

        return true;
    }

    return false;    
}